

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_cod.c
# Opt level: O2

int pnm_maxvaltodepth(uint_fast32_t maxval)

{
  int n;
  
  n = 0;
  for (; maxval != 0; maxval = maxval >> 1) {
    n = n + 1;
  }
  return n;
}

Assistant:

int pnm_maxvaltodepth(uint_fast32_t maxval)
{
	int n;

	n = 0;
	while (maxval > 0) {
		maxval >>= 1;
		++n;
	}
	return n;
}